

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O3

int __thiscall
QtMWidgets::NavigationButtonPrivate::init(NavigationButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ColorGroup CVar6;
  long *plVar7;
  
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  CVar6 = QWidget::palette();
  plVar7 = (long *)QPalette::brush(CVar6,Dark);
  lVar3 = *plVar7;
  uVar4 = *(undefined8 *)(lVar3 + 0xe);
  *(undefined8 *)&this->baseColor = *(undefined8 *)(lVar3 + 8);
  *(undefined8 *)((long)&(this->baseColor).ct + 2) = uVar4;
  uVar1 = *(ushort *)(lVar3 + 0x14);
  uVar2 = *(undefined4 *)(lVar3 + 0x10);
  *(undefined8 *)&this->color = *(undefined8 *)(lVar3 + 8);
  *(undefined4 *)((long)&(this->color).ct + 4) = uVar2;
  (this->color).ct.argb.pad = uVar1;
  uVar4 = *(undefined8 *)&this->baseColor;
  uVar5 = *(undefined8 *)((long)&(this->baseColor).ct + 2);
  *(undefined8 *)&this->textColor = uVar4;
  *(undefined8 *)((long)&(this->textColor).ct + 2) = uVar5;
  return (int)uVar4;
}

Assistant:

void
NavigationButtonPrivate::init()
{
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Fixed );
	q->setAutoFillBackground( true );
	q->setBackgroundRole( QPalette::Base );

	baseColor = q->palette().color( QPalette::Highlight );
	color = baseColor;
	textColor = baseColor;
}